

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::OutOfRangeException::OutOfRangeException<unsigned_long,unsigned_long,unsigned_long>
          (OutOfRangeException *this,string *msg,unsigned_long params,unsigned_long params_1,
          unsigned_long params_2)

{
  unsigned_long in_R9;
  string local_30;
  
  Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long>
            (&local_30,(Exception *)msg,(string *)params,params_1,params_2,in_R9);
  OutOfRangeException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit OutOfRangeException(const string &msg, ARGS... params)
	    : OutOfRangeException(ConstructMessage(msg, params...)) {
	}